

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::BlendShape>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,BlendShape *bs,
               string *warn,string *err,PrimReconstructOptions *options)

{
  ReferenceList *this;
  bool bVar1;
  string *psVar2;
  size_type sVar3;
  mapped_type *this_00;
  ostream *poVar4;
  Property *pPVar5;
  Property *in_stack_fffffffffffff5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0 [32];
  string local_9a0 [32];
  ostringstream local_980 [8];
  ostringstream ss_e_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8 [39];
  allocator local_7b1;
  string local_7b0 [32];
  string local_790;
  ostringstream local_770 [8];
  ostringstream ss_e_2;
  allocator local_5f1;
  undefined1 local_5f0 [32];
  undefined1 local_5d0 [40];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568 [39];
  allocator local_541;
  string local_540 [32];
  string local_520;
  ostringstream local_500 [8];
  ostringstream ss_e_1;
  allocator local_381;
  undefined1 local_380 [32];
  undefined1 local_360 [40];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  string local_2b0;
  ostringstream local_290 [8];
  ostringstream ss_e;
  undefined4 local_118;
  allocator local_111;
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  char *kPointIndices;
  char *kNormalOffsets;
  char *kOffsets;
  string *err_local;
  string *warn_local;
  BlendShape *bs_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  kNormalOffsets = "offsets";
  kPointIndices = "normalOffsets";
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)anon_var_dwarf_444653;
  kOffsets = (char *)err;
  err_local = warn;
  warn_local = &bs->name;
  bs_local = (BlendShape *)references;
  references_local = (ReferenceList *)properties;
  properties_local = (PropertyMap *)spec;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range2);
  this = references_local;
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    *)references_local);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                   *)this);
  do {
    bVar1 = ::std::operator!=(&__end2,(_Self *)&prop);
    if (!bVar1) {
      spec_local._7_1_ = 1;
LAB_002ac552:
      ::std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range2);
      return (bool)(spec_local._7_1_ & 1);
    }
    ret.err.field_2._8_8_ =
         ::std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
         ::operator*(&__end2);
    ::std::__cxx11::string::string((string *)local_f0,(string *)ret.err.field_2._8_8_);
    psVar2 = (string *)(ret.err.field_2._8_8_ + 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_110,"offsets",&local_111);
    pPVar5 = (Property *)local_110;
    (anonymous_namespace)::
    ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
              ((ParseResult *)local_d0,(_anonymous_namespace_ *)&__range2,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f0,psVar2,pPVar5,(string *)&warn_local[1].field_2,
               (TypedAttribute<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                *)in_stack_fffffffffffff5e8);
    ::std::__cxx11::string::~string((string *)local_110);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
    ::std::__cxx11::string::~string((string *)local_f0);
    if ((local_d0._0_4_ == Success) || (local_d0._0_4_ == AlreadyProcessed)) {
      local_118 = 3;
    }
    else if (local_d0._0_4_ == Unmatched) {
      local_118 = _S_red;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_290);
      poVar4 = ::std::operator<<((ostream *)local_290,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xbd2);
      ::std::operator<<(poVar4," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_2d0,"Parsing attribute `{}` failed. Error: {}",&local_2d1);
      fmt::format<char_const*,std::__cxx11::string>
                (&local_2b0,(fmt *)local_2d0,(string *)&kNormalOffsets,(char **)&ret,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
      poVar4 = ::std::operator<<((ostream *)local_290,(string *)&local_2b0);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::~string((string *)&local_2b0);
      ::std::__cxx11::string::~string(local_2d0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      if (kOffsets != (char *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_2f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ret_1.err.field_2._M_local_buf + 8));
        ::std::__cxx11::string::operator=((string *)kOffsets,(string *)local_2f8);
        ::std::__cxx11::string::~string((string *)local_2f8);
        ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
      }
      spec_local._7_1_ = 0;
      local_118 = _S_black;
      ::std::__cxx11::ostringstream::~ostringstream(local_290);
    }
    anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_d0);
    if (local_118 == _S_red) {
      ::std::__cxx11::string::string((string *)local_360,(string *)ret.err.field_2._8_8_);
      psVar2 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_380,"normalOffsets",&local_381);
      pPVar5 = (Property *)local_380;
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                ((ParseResult *)(local_360 + 0x20),(_anonymous_namespace_ *)&__range2,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_360,psVar2,pPVar5,warn_local + 0x14,
                 (TypedAttribute<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
                  *)in_stack_fffffffffffff5e8);
      ::std::__cxx11::string::~string((string *)local_380);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
      ::std::__cxx11::string::~string((string *)local_360);
      if ((local_360._32_4_ == 0) || (local_360._32_4_ == 2)) {
        local_118 = 3;
      }
      else if (local_360._32_4_ == 1) {
        local_118 = _S_red;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_500);
        poVar4 = ::std::operator<<((ostream *)local_500,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xbd3);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_540,"Parsing attribute `{}` failed. Error: {}",&local_541);
        fmt::format<char_const*,std::__cxx11::string>
                  (&local_520,(fmt *)local_540,(string *)&kPointIndices,(char **)&ret_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
        poVar4 = ::std::operator<<((ostream *)local_500,(string *)&local_520);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_520);
        ::std::__cxx11::string::~string(local_540);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_541);
        if (kOffsets != (char *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_568,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_2.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=((string *)kOffsets,(string *)local_568);
          ::std::__cxx11::string::~string((string *)local_568);
          ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_118 = _S_black;
        ::std::__cxx11::ostringstream::~ostringstream(local_500);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_360 + 0x20));
      if (local_118 != _S_red) goto joined_r0x002ac0e3;
      ::std::__cxx11::string::string((string *)local_5d0,(string *)ret.err.field_2._8_8_);
      psVar2 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_5f0,"pointIndices",&local_5f1);
      pPVar5 = (Property *)local_5f0;
      (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                ((ParseResult *)(local_5d0 + 0x20),(_anonymous_namespace_ *)&__range2,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5d0,psVar2,pPVar5,(string *)&warn_local[0x26].field_2,
                 (TypedAttribute<std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffff5e8);
      ::std::__cxx11::string::~string((string *)local_5f0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
      ::std::__cxx11::string::~string((string *)local_5d0);
      if ((local_5d0._32_4_ == 0) || (local_5d0._32_4_ == 2)) {
        local_118 = 3;
      }
      else if (local_5d0._32_4_ == 1) {
        local_118 = _S_red;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_770);
        poVar4 = ::std::operator<<((ostream *)local_770,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xbd4);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_7b0,"Parsing attribute `{}` failed. Error: {}",&local_7b1);
        fmt::format<char_const*,std::__cxx11::string>
                  (&local_790,(fmt *)local_7b0,
                   (string *)&table._M_t._M_impl.super__Rb_tree_header._M_node_count,(char **)&ret_2
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar5);
        poVar4 = ::std::operator<<((ostream *)local_770,(string *)&local_790);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_790);
        ::std::__cxx11::string::~string(local_7b0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
        if (kOffsets != (char *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_7d8,local_7f8);
          ::std::__cxx11::string::operator=((string *)kOffsets,(string *)local_7d8);
          ::std::__cxx11::string::~string((string *)local_7d8);
          ::std::__cxx11::string::~string((string *)local_7f8);
        }
        spec_local._7_1_ = 0;
        local_118 = _S_black;
        ::std::__cxx11::ostringstream::~ostringstream(local_770);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_5d0 + 0x20));
      if (local_118 != _S_red) goto joined_r0x002ac0e3;
      sVar3 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2,(key_type *)ret.err.field_2._8_8_);
      if (sVar3 == 0) {
        in_stack_fffffffffffff5e8 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        this_00 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                *)&warn_local[0x3c].field_2,(key_type *)ret.err.field_2._8_8_);
        Property::operator=(this_00,in_stack_fffffffffffff5e8);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2,(value_type *)ret.err.field_2._8_8_);
      }
      sVar3 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range2,(key_type *)ret.err.field_2._8_8_);
      if (sVar3 == 0) {
        ::std::__cxx11::ostringstream::ostringstream(local_980);
        poVar4 = ::std::operator<<((ostream *)local_980,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructPrim");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xbd6);
        ::std::operator<<(poVar4," ");
        ::std::operator+((char *)local_9a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Unsupported/unimplemented property: ");
        poVar4 = ::std::operator<<((ostream *)local_980,local_9a0);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string(local_9a0);
        if (kOffsets != (char *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_9c0,local_9e0);
          ::std::__cxx11::string::operator=((string *)kOffsets,(string *)local_9c0);
          ::std::__cxx11::string::~string((string *)local_9c0);
          ::std::__cxx11::string::~string((string *)local_9e0);
        }
        spec_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_980);
        goto LAB_002ac552;
      }
    }
    else {
joined_r0x002ac0e3:
      if (local_118 != 3) goto LAB_002ac552;
    }
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool ReconstructPrim<BlendShape>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    BlendShape *bs,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)spec;
  (void)warn;
  (void)references;
  (void)options;

  DCOUT("Reconstruct BlendShape");

  constexpr auto kOffsets = "offsets";
  constexpr auto kNormalOffsets = "normalOffsets";
  constexpr auto kPointIndices = "pointIndices";

  std::set<std::string> table;
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, kOffsets, BlendShape, bs->offsets)
    PARSE_TYPED_ATTRIBUTE(table, prop, kNormalOffsets, BlendShape, bs->normalOffsets)
    PARSE_TYPED_ATTRIBUTE(table, prop, kPointIndices, BlendShape, bs->pointIndices)
    ADD_PROPERTY(table, prop, Skeleton, bs->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

#if 0 // TODO: Check required properties exist in strict mode.
  // `offsets` and `normalOffsets` are required property
  if (!table.count(kOffsets)) {
    PUSH_ERROR_AND_RETURN("`offsets` property is missing. `uniform vector3f[] offsets` is a required property.");
  }
  if (!table.count(kNormalOffsets)) {
    PUSH_ERROR_AND_RETURN("`normalOffsets` property is missing. `uniform vector3f[] normalOffsets` is a required property.");
  }
#endif

  return true;
}